

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O2

bool __thiscall
skiwi::environment<skiwi::alpha_conversion_data>::find
          (environment<skiwi::alpha_conversion_data> *this,alpha_conversion_data *e,string *name)

{
  iterator iVar1;
  bool bVar2;
  shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>_> p_outer_copy;
  __shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
  local_38;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->env)._M_t._M_impl.super__Rb_tree_header) {
    std::__shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_38,
                   &(this->p_outer).
                    super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
                  );
    while( true ) {
      bVar2 = local_38._M_ptr != (element_type *)0x0;
      if (local_38._M_ptr == (element_type *)0x0) break;
      iVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::alpha_conversion_data>_>_>
                      *)local_38._M_ptr,name);
      if ((_Rb_tree_header *)iVar1._M_node !=
          &((local_38._M_ptr)->env)._M_t._M_impl.super__Rb_tree_header) {
        alpha_conversion_data::operator=(e,(alpha_conversion_data *)(iVar1._M_node + 2));
        break;
      }
      std::
      __shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>::
      operator=(&local_38,
                &((local_38._M_ptr)->p_outer).
                 super___shared_ptr<skiwi::environment<skiwi::alpha_conversion_data>,_(__gnu_cxx::_Lock_policy)2>
               );
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  }
  else {
    alpha_conversion_data::operator=(e,(alpha_conversion_data *)(iVar1._M_node + 2));
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool find(TEntry& e, const std::string& name)
      {
      auto it = env.find(name);
      if (it != env.end())
        {
        e = it->second;
        return true;
        }
      auto p_outer_copy = p_outer;
      while (p_outer_copy)
        {
        it = p_outer_copy->env.find(name);
        if (it != p_outer_copy->env.end())
          {
          e = it->second;
          return true;
          }
        p_outer_copy = p_outer_copy->p_outer;
        }
      return false;
      }